

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O1

void __thiscall
Encoder::CopyMaps<false>
          (Encoder *this,OffsetList **m_origInlineeFrameRecords,OffsetList **m_origInlineeFrameMap,
          OffsetList **m_origPragmaInstrToRecordOffset,OffsetList **m_origOffsetBuffer)

{
  Type *pTVar1;
  List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  Type pAVar2;
  ArenaAllocator *pAVar3;
  Type pIVar4;
  Type pPVar5;
  uint32 *puVar6;
  code *pcVar7;
  bool bVar8;
  undefined4 *puVar9;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar10;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_03;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_04;
  OffsetList *pOVar11;
  Type *ppIVar12;
  Type *pTVar13;
  Type *ppPVar14;
  int iVar15;
  ulong uVar16;
  
  this_00 = this->m_inlineeFrameRecords;
  this_01 = this->m_inlineeFrameMap;
  this_02 = this->m_pragmaInstrToRecordOffset;
  if (*m_origInlineeFrameRecords != (OffsetList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x601,"(*m_origInlineeFrameRecords == nullptr)",
                       "*m_origInlineeFrameRecords == nullptr");
    if (!bVar8) goto LAB_00410d52;
    *puVar9 = 0;
  }
  if (*m_origInlineeFrameMap != (OffsetList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x602,"(*m_origInlineeFrameMap == nullptr)",
                       "*m_origInlineeFrameMap == nullptr");
    if (!bVar8) goto LAB_00410d52;
    *puVar9 = 0;
  }
  if (*m_origPragmaInstrToRecordOffset != (OffsetList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x603,"(*m_origPragmaInstrToRecordOffset == nullptr)",
                       "*m_origPragmaInstrToRecordOffset == nullptr");
    if (!bVar8) goto LAB_00410d52;
    *puVar9 = 0;
  }
  pLVar10 = (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::ArenaAllocator>(0x30,this->m_tempAlloc,0x366bee);
  pAVar2 = this->m_tempAlloc;
  (pLVar10->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
       (Type)0x0;
  (pLVar10->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  (pLVar10->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc =
       pAVar2;
  (pLVar10->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014ea098;
  pLVar10->length = 0;
  pLVar10->increment = 4;
  *m_origInlineeFrameRecords = pLVar10;
  this_03 = (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::ArenaAllocator>(0x30,this->m_tempAlloc,0x366bee);
  pAVar2 = this->m_tempAlloc;
  (this_03->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
       (Type)0x0;
  (this_03->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  (this_03->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc =
       pAVar2;
  (this_03->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014ea098;
  this_03->length = 0;
  this_03->increment = 4;
  *m_origInlineeFrameMap = this_03;
  this_04 = (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::ArenaAllocator>(0x30,this->m_tempAlloc,0x366bee);
  pAVar2 = this->m_tempAlloc;
  (this_04->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
       (Type)0x0;
  (this_04->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  (this_04->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc =
       pAVar2;
  (this_04->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014ea098;
  this_04->length = 0;
  this_04->increment = 4;
  *m_origPragmaInstrToRecordOffset = this_04;
  if (*m_origOffsetBuffer != (OffsetList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x60a,"((*m_origOffsetBuffer) == nullptr)",
                       "(*m_origOffsetBuffer) == nullptr");
    if (!bVar8) {
LAB_00410d52:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar9 = 0;
  }
  iVar15 = 0;
  pOVar11 = (OffsetList *)new<Memory::ArenaAllocator>(0x30,this->m_tempAlloc,0x366bee);
  pAVar3 = this->m_tempAlloc;
  (pOVar11->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
       (Type)0x0;
  (pOVar11->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  (pOVar11->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc =
       pAVar3;
  (pOVar11->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014ea098;
  pOVar11->length = 0;
  pOVar11->increment = 4;
  *m_origOffsetBuffer = pOVar11;
  if (0 < (this_00->
          super_ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>).count)
  {
    do {
      ppIVar12 = JsUtil::
                 List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this_00,iVar15);
      pIVar4 = *ppIVar12;
      JsUtil::
      List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      EnsureArray(pLVar10,0);
      (pLVar10->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer
      [(pLVar10->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count] =
           pIVar4->inlineeStartOffset;
      pTVar1 = &(pLVar10->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>)
                .count;
      *pTVar1 = *pTVar1 + 1;
      iVar15 = iVar15 + 1;
    } while (iVar15 < (this_00->
                      super_ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>
                      ).count);
  }
  if (0 < (this_01->
          super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>)
          .count) {
    iVar15 = 0;
    do {
      pTVar13 = JsUtil::
                List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_01,iVar15);
      JsUtil::
      List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      EnsureArray(this_03,0);
      (this_03->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer
      [(this_03->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count] =
           pTVar13->offset;
      pTVar1 = &(this_03->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>)
                .count;
      *pTVar1 = *pTVar1 + 1;
      iVar15 = iVar15 + 1;
    } while (iVar15 < (this_01->
                      super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
                      ).count);
  }
  if (0 < (this_02->super_ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>).
          count) {
    iVar15 = 0;
    do {
      ppPVar14 = JsUtil::
                 List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this_02,iVar15);
      pPVar5 = *ppPVar14;
      JsUtil::
      List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      EnsureArray(this_04,0);
      (this_04->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer
      [(this_04->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count] =
           pPVar5->m_offsetInBuffer;
      pTVar1 = &(this_04->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>)
                .count;
      *pTVar1 = *pTVar1 + 1;
      iVar15 = iVar15 + 1;
    } while (iVar15 < (this_02->
                      super_ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>
                      ).count);
  }
  if (this->m_instrNumber != 0) {
    uVar16 = 0;
    do {
      pLVar10 = *m_origOffsetBuffer;
      puVar6 = this->m_offsetBuffer;
      JsUtil::
      List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      EnsureArray(pLVar10,0);
      (pLVar10->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer
      [(pLVar10->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count] =
           puVar6[uVar16];
      pTVar1 = &(pLVar10->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>)
                .count;
      *pTVar1 = *pTVar1 + 1;
      uVar16 = uVar16 + 1;
    } while (uVar16 < this->m_instrNumber);
  }
  return;
}

Assistant:

void Encoder::CopyMaps(OffsetList **m_origInlineeFrameRecords
    , OffsetList **m_origInlineeFrameMap
    , OffsetList **m_origPragmaInstrToRecordOffset
    , OffsetList **m_origOffsetBuffer
    )
{
    InlineeFrameRecords *recList = m_inlineeFrameRecords;
    ArenaInlineeFrameMap *mapList = m_inlineeFrameMap;
    PragmaInstrList *pInstrList = m_pragmaInstrToRecordOffset;

    OffsetList *origRecList, *origMapList, *origPInstrList;
    if (!restore)
    {
        Assert(*m_origInlineeFrameRecords == nullptr);
        Assert(*m_origInlineeFrameMap == nullptr);
        Assert(*m_origPragmaInstrToRecordOffset == nullptr);

        *m_origInlineeFrameRecords = origRecList = Anew(m_tempAlloc, OffsetList, m_tempAlloc);
        *m_origInlineeFrameMap = origMapList = Anew(m_tempAlloc, OffsetList, m_tempAlloc);
        *m_origPragmaInstrToRecordOffset = origPInstrList = Anew(m_tempAlloc, OffsetList, m_tempAlloc);

#if DBG_DUMP
        Assert((*m_origOffsetBuffer) == nullptr);
        *m_origOffsetBuffer = Anew(m_tempAlloc, OffsetList, m_tempAlloc);
#endif
    }
    else
    {
        Assert((*m_origInlineeFrameRecords) && (*m_origInlineeFrameMap) && (*m_origPragmaInstrToRecordOffset));
        origRecList = *m_origInlineeFrameRecords;
        origMapList = *m_origInlineeFrameMap;
        origPInstrList = *m_origPragmaInstrToRecordOffset;
        Assert(origRecList->Count() == recList->Count());
        Assert(origMapList->Count() == mapList->Count());
        Assert(origPInstrList->Count() == pInstrList->Count());

#if DBG_DUMP
        Assert(m_origOffsetBuffer);
        Assert((uint32)(*m_origOffsetBuffer)->Count() == m_instrNumber);
#endif
    }

    for (int i = 0; i < recList->Count(); i++)
    {
        if (!restore)
        {
            origRecList->Add(recList->Item(i)->inlineeStartOffset);
        }
        else
        {
            recList->Item(i)->inlineeStartOffset = origRecList->Item(i);
        }
    }

    for (int i = 0; i < mapList->Count(); i++)
    {
        if (!restore)
        {
            origMapList->Add(mapList->Item(i).offset);
        }
        else
        {
            mapList->Item(i).offset = origMapList->Item(i);
        }
    }

    for (int i = 0; i < pInstrList->Count(); i++)
    {
        if (!restore)
        {
            origPInstrList->Add(pInstrList->Item(i)->m_offsetInBuffer);
        }
        else
        {
            pInstrList->Item(i)->m_offsetInBuffer = origPInstrList->Item(i);
        }
    }

    if (restore)
    {
        (*m_origInlineeFrameRecords)->Delete();
        (*m_origInlineeFrameMap)->Delete();
        (*m_origPragmaInstrToRecordOffset)->Delete();
        (*m_origInlineeFrameRecords) = nullptr;
        (*m_origInlineeFrameMap) = nullptr;
        (*m_origPragmaInstrToRecordOffset) = nullptr;
    }

#if DBG_DUMP
    for (uint i = 0; i < m_instrNumber; i++)
    {
        if (!restore)
        {
            (*m_origOffsetBuffer)->Add(m_offsetBuffer[i]);
        }
        else
        {
            m_offsetBuffer[i] = (*m_origOffsetBuffer)->Item(i);
        }
    }

    if (restore)
    {
        (*m_origOffsetBuffer)->Delete();
        (*m_origOffsetBuffer) = nullptr;
    }
#endif
}